

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

void Dch_ClassesPrepare(Dch_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  int *piVar1;
  Aig_Man_t *p_00;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  void *__ptr;
  void *__ptr_00;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t **ppAVar8;
  long lVar9;
  long lVar10;
  Vec_Ptr_t *p_01;
  ulong uVar11;
  Aig_Obj_t **ppAVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  
  p_01 = p->pAig->vObjs;
  iVar4 = p_01->nSize;
  uVar13 = iVar4 / 4 - 1;
  do {
    do {
      uVar14 = uVar13 + 1;
      uVar5 = uVar13 & 1;
      uVar13 = uVar14;
    } while (uVar5 != 0);
    uVar11 = 3;
    do {
      iVar15 = (int)uVar11;
      if (uVar14 < (uint)(iVar15 * iVar15)) {
        __ptr = calloc((long)(int)uVar14,8);
        __ptr_00 = calloc((long)iVar4,8);
        iVar15 = 0;
        uVar13 = 0;
        goto LAB_004c266b;
      }
      uVar3 = (ulong)uVar14 % uVar11;
      uVar11 = (ulong)(iVar15 + 2);
    } while ((int)uVar3 != 0);
  } while( true );
LAB_004c266b:
  if (iVar4 <= iVar15) {
    ppAVar8 = (Aig_Obj_t **)malloc(((long)p->nCands1 + (long)(int)uVar13) * 8);
    p->pMemClasses = ppAVar8;
    p->pMemClassesFree = ppAVar8 + (int)uVar13;
    iVar15 = 0;
    uVar5 = 0;
    do {
      if (iVar4 <= iVar15) {
        if (uVar13 != uVar5) {
          __assert_fail("nEntries == nEntries2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                        ,0x1a8,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
        }
        free(__ptr);
        free(__ptr_00);
        Dch_ClassesRefine(p);
        Dch_ClassesCheck(p);
        return;
      }
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar15);
      if ((pAVar6 != (Aig_Obj_t *)0x0) &&
         ((uVar14 = *(uint *)&pAVar6->field_0x18 & 7, uVar14 == 2 || (uVar14 - 5 < 2)))) {
        lVar10 = (long)pAVar6->Id;
        uVar14 = p->pClassSizes[lVar10];
        if ((ulong)uVar14 != 0) {
          if ((int)uVar14 < 2) {
            __assert_fail("nNodes > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x199,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
          }
          ppAVar12 = p->pMemClasses;
          ppAVar8 = ppAVar12 + uVar5;
          *ppAVar8 = pAVar6;
          ppAVar12 = ppAVar12 + (ulong)uVar5 + (ulong)uVar14;
          lVar9 = lVar10;
          while( true ) {
            ppAVar12 = ppAVar12 + -1;
            pAVar7 = *(Aig_Obj_t **)((long)__ptr_00 + lVar9 * 8);
            if (pAVar7 == (Aig_Obj_t *)0x0) break;
            *ppAVar12 = pAVar7;
            lVar9 = (long)pAVar7->Id;
          }
          p->pClassSizes[lVar10] = 0;
          Dch_ObjAddClass(p,pAVar6,ppAVar8,uVar14);
          uVar5 = uVar5 + uVar14;
        }
      }
      iVar15 = iVar15 + 1;
      p_01 = p->pAig->vObjs;
      iVar4 = p_01->nSize;
    } while( true );
  }
  pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar15);
  if (pAVar6 != (Aig_Obj_t *)0x0) {
    uVar5 = (uint)*(undefined8 *)&pAVar6->field_0x18;
    if (fLatchCorr == 0) {
      uVar5 = uVar5 & 7;
      if (((uVar5 == 2) || (uVar5 - 5 < 2)) &&
         ((nMaxLevs == 0 ||
          ((int)((uint)((ulong)*(undefined8 *)&pAVar6->field_0x18 >> 0x20) & 0xffffff) < nMaxLevs)))
         ) goto LAB_004c26a4;
    }
    else if ((uVar5 & 7) == 2) {
LAB_004c26a4:
      iVar4 = (*p->pFuncNodeIsConst)(p->pManData,pAVar6);
      if (iVar4 == 0) {
        uVar5 = (*p->pFuncNodeHash)(p->pManData,pAVar6);
        pAVar7 = *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar5 % uVar14) * 8);
        if (pAVar7 == (Aig_Obj_t *)0x0) {
          *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar5 % uVar14) * 8) = pAVar6;
        }
        else {
          Aig_ObjSetRepr(p->pAig,pAVar6,pAVar7);
          lVar9 = (long)pAVar7->Id;
          lVar10 = *(long *)((long)__ptr_00 + lVar9 * 8);
          piVar2 = p->pClassSizes;
          if (lVar10 == 0) {
            piVar1 = piVar2 + lVar9;
            *piVar1 = *piVar1 + 1;
            uVar13 = uVar13 + 1;
            lVar9 = (long)pAVar7->Id;
            lVar10 = *(long *)((long)__ptr_00 + lVar9 * 8);
          }
          *(long *)((long)__ptr_00 + (long)pAVar6->Id * 8) = lVar10;
          *(Aig_Obj_t **)((long)__ptr_00 + lVar9 * 8) = pAVar6;
          piVar2 = piVar2 + lVar9;
          *piVar2 = *piVar2 + 1;
          uVar13 = uVar13 + 1;
        }
      }
      else {
        p_00 = p->pAig;
        if (p_00->pReprs == (Aig_Obj_t **)0x0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = p_00->pReprs[pAVar6->Id];
        }
        if (pAVar7 == p_00->pConst1) {
          __assert_fail("!Dch_ObjIsConst1Cand( pAig, pObj )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchInt.h"
                        ,0x72,"void Dch_ObjSetConst1Cand(Aig_Man_t *, Aig_Obj_t *)");
        }
        Aig_ObjSetRepr(p_00,pAVar6,p_00->pConst1);
        p->nCands1 = p->nCands1 + 1;
      }
    }
  }
  iVar15 = iVar15 + 1;
  p_01 = p->pAig->vObjs;
  iVar4 = p_01->nSize;
  goto LAB_004c266b;
}

Assistant:

void Dch_ClassesPrepare( Dch_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig)/4 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) ); 

    // add all the nodes to the hash table
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level >= nMaxLevs )
                continue;
        }
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Dch_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
            ppTable[iEntry] = pObj;
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Dch_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Dch_ObjSetNext( ppNexts, pObj, Dch_ObjNext( ppNexts, pRepr ) );
            Dch_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, nEntries + p->nCands1 );
    p->pMemClassesFree = p->pMemClasses + nEntries;
 
    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClasses + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Dch_ObjNext(ppNexts, pObj), k = 1; pTemp; 
              pTemp = Dch_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Dch_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Dch_ClassesRefine( p );
    Dch_ClassesCheck( p );
}